

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

lua_Integer luaL_len(lua_State *L,int idx)

{
  lua_Integer lVar1;
  int isnum;
  int local_1c;
  
  lua_len(L,idx);
  lVar1 = lua_tointegerx(L,-1,&local_1c);
  if (local_1c == 0) {
    luaL_error(L,"object length is not an integer");
  }
  lua_settop(L,-2);
  return lVar1;
}

Assistant:

LUALIB_API lua_Integer luaL_len (lua_State *L, int idx) {
  lua_Integer l;
  int isnum;
  lua_len(L, idx);
  l = lua_tointegerx(L, -1, &isnum);
  if (!isnum)
    luaL_error(L, "object length is not an integer");
  lua_pop(L, 1);  /* remove object */
  return l;
}